

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uecc.c
# Opt level: O0

int secp256r1_on_exchange
              (ptls_key_exchange_context_t *_ctx,ptls_iovec_t *secret,ptls_iovec_t peerkey)

{
  int iVar1;
  uECC_Curve curve;
  ptls_iovec_t pVar2;
  uint8_t *local_50;
  size_t local_48;
  int local_3c;
  uint8_t *puStack_38;
  int ret;
  uint8_t *secbytes;
  st_secp256r1_key_exhchange_t *ctx;
  ptls_iovec_t *secret_local;
  ptls_key_exchange_context_t *_ctx_local;
  ptls_iovec_t peerkey_local;
  
  puStack_38 = (uint8_t *)0x0;
  if (secret == (ptls_iovec_t *)0x0) {
    local_3c = 0;
  }
  else if ((peerkey.len == 0x41) && (*peerkey.base == '\x04')) {
    puStack_38 = (uint8_t *)malloc(0x20);
    if (puStack_38 == (uint8_t *)0x0) {
      local_3c = 0x201;
    }
    else {
      curve = uECC_secp256r1();
      iVar1 = uECC_shared_secret(peerkey.base + 1,(uint8_t *)(_ctx + 1),puStack_38,curve);
      if (iVar1 == 0) {
        local_3c = 0x33;
      }
      else {
        pVar2 = ptls_iovec_init(puStack_38,0x20);
        local_50 = pVar2.base;
        secret->base = local_50;
        local_48 = pVar2.len;
        secret->len = local_48;
        local_3c = 0;
      }
    }
  }
  else {
    local_3c = 0x33;
  }
  if (local_3c != 0) {
    free(puStack_38);
  }
  (*ptls_clear_memory)(_ctx + 1,0x20);
  free(_ctx);
  return local_3c;
}

Assistant:

static int secp256r1_on_exchange(ptls_key_exchange_context_t *_ctx, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    struct st_secp256r1_key_exhchange_t *ctx = (struct st_secp256r1_key_exhchange_t *)_ctx;
    uint8_t *secbytes = NULL;
    int ret;

    if (secret == NULL) {
        ret = 0;
        goto Exit;
    }

    if (peerkey.len != SECP256R1_PUBLIC_KEY_SIZE || peerkey.base[0] != TYPE_UNCOMPRESSED_PUBLIC_KEY) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    if ((secbytes = (uint8_t *)malloc(SECP256R1_SHARED_SECRET_SIZE)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (!uECC_shared_secret(peerkey.base + 1, ctx->priv, secbytes, uECC_secp256r1())) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    *secret = ptls_iovec_init(secbytes, SECP256R1_SHARED_SECRET_SIZE);
    ret = 0;

Exit:
    if (ret != 0)
        free(secbytes);
    ptls_clear_memory(ctx->priv, sizeof(ctx->priv));
    free(ctx);
    return ret;
}